

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

Span<char> __thiscall
absl::cord_internal::CordRepBtree::GetAppendBufferSlow(CordRepBtree *this,size_t size)

{
  byte bVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  CordRepBtree *pCVar5;
  pointer pcVar6;
  sbyte sVar7;
  ulong uVar8;
  sbyte sVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  Span<char> SVar13;
  CordRepBtree *stack [12];
  long local_68 [13];
  
  if ((this->super_CordRep).storage[0] < 4) {
    __assert_fail("height() >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3f3,"Span<char> absl::cord_internal::CordRepBtree::GetAppendBufferSlow(size_t)"
                 );
  }
  if ((this->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
    __assert_fail("refcount.IsOne()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3f4,"Span<char> absl::cord_internal::CordRepBtree::GetAppendBufferSlow(size_t)"
                 );
  }
  uVar11 = (ulong)(this->super_CordRep).storage[0];
  pCVar5 = this;
  if (uVar11 != 0) {
    sVar10 = 0;
    uVar8 = 0;
    do {
      pCVar5 = *(CordRepBtree **)
                ((pCVar5->super_CordRep).storage +
                (ulong)(pCVar5->super_CordRep).storage[2] * 8 + -5);
      if ((pCVar5->super_CordRep).tag != '\x03') {
        __assert_fail("IsBtree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                      ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
      }
      if ((pCVar5->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
        pcVar6 = (pointer)0x0;
        goto LAB_00179010;
      }
      local_68[uVar8] = (long)pCVar5;
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
  }
  plVar2 = *(long **)((pCVar5->super_CordRep).storage +
                     (ulong)(pCVar5->super_CordRep).storage[2] * 8 + -5);
  sVar10 = 0;
  pcVar6 = (pointer)0x0;
  if ((int)plVar2[1] == 2) {
    bVar1 = *(byte *)((long)plVar2 + 0xc);
    sVar10 = 0;
    pcVar6 = (pointer)0x0;
    if (5 < bVar1) {
      if (0xf8 < bVar1) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
      }
      sVar9 = 0xc;
      if (bVar1 < 0xbb) {
        sVar9 = 6;
      }
      iVar12 = -0xb800d;
      if (bVar1 < 0xbb) {
        iVar12 = -0xe8d;
      }
      sVar7 = 3;
      if (0x42 < bVar1) {
        sVar7 = sVar9;
      }
      iVar4 = -0x1d;
      if (0x42 < bVar1) {
        iVar4 = iVar12;
      }
      lVar3 = *plVar2;
      sVar10 = 0;
      pcVar6 = (pointer)0x0;
      uVar8 = (int)(((uint)bVar1 << sVar7) + iVar4) - lVar3;
      if (uVar8 != 0) {
        sVar10 = size;
        if (uVar8 < size) {
          sVar10 = uVar8;
        }
        *plVar2 = sVar10 + lVar3;
        (this->super_CordRep).length = (this->super_CordRep).length + sVar10;
        pcVar6 = (pointer)((long)plVar2 + lVar3 + 0xd);
        if (uVar11 != 0) {
          uVar8 = 0;
          do {
            *(long *)local_68[uVar8] = *(long *)local_68[uVar8] + sVar10;
            uVar8 = uVar8 + 1;
          } while (uVar11 != uVar8);
        }
      }
    }
  }
LAB_00179010:
  SVar13.len_ = sVar10;
  SVar13.ptr_ = pcVar6;
  return SVar13;
}

Assistant:

Span<char> CordRepBtree::GetAppendBufferSlow(size_t size) {
  // The inlined version in `GetAppendBuffer()` deals with all heights <= 3.
  assert(height() >= 4);
  assert(refcount.IsOne());

  // Build a stack of nodes we may potentially need to update if we find a
  // non-shared FLAT with capacity at the leaf level.
  const int depth = height();
  CordRepBtree* node = this;
  CordRepBtree* stack[kMaxDepth];
  for (int i = 0; i < depth; ++i) {
    node = node->Edge(kBack)->btree();
    if (!node->refcount.IsOne()) return {};
    stack[i] = node;
  }

  // Must be a privately owned, mutable flat.
  CordRep* const edge = node->Edge(kBack);
  if (!edge->refcount.IsOne() || edge->tag < FLAT) return {};

  // Must have capacity.
  const size_t avail = edge->flat()->Capacity() - edge->length;
  if (avail == 0) return {};

  // Build span on remaining capacity.
  size_t delta = (std::min)(size, avail);
  Span<char> span = {edge->flat()->Data() + edge->length, delta};
  edge->length += delta;
  this->length += delta;
  for (int i = 0; i < depth; ++i) {
    stack[i]->length += delta;
  }
  return span;
}